

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesImageMemoryAliasing.cpp
# Opt level: O0

TestCaseGroup * vkt::sparse::createImageSparseMemoryAliasingTests(TestContext *testCtx)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  TestCaseGroup *pTVar4;
  char *pcVar5;
  ostream *poVar6;
  TestNode *pTVar7;
  ImageSparseMemoryAliasingCase *this;
  TestNode *pTVar8;
  ImageType imageType_00;
  TextureFormat *format_00;
  allocator<char> local_279;
  string local_278;
  string local_258;
  ostringstream local_238 [8];
  ostringstream stream;
  undefined1 local_bc [8];
  UVec3 imageSize;
  deInt32 imageSizeNdx;
  undefined1 local_88 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> formatGroup;
  TextureFormat *format;
  deInt32 formatNdx;
  undefined1 local_48 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> imageTypeGroup;
  ImageType imageType;
  deInt32 imageTypeNdx;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> testGroup;
  TestContext *testCtx_local;
  
  testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
  _8_8_ = testCtx;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar4,(TestContext *)
                    testGroup.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"image_sparse_memory_aliasing","Sparse Image Memory Aliasing");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&imageType + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  if (createImageSparseMemoryAliasingTests(tcu::TestContext&)::imageParametersArray == '\0') {
    iVar2 = __cxa_guard_acquire(&createImageSparseMemoryAliasingTests(tcu::TestContext&)::
                                 imageParametersArray);
    if (iVar2 != 0) {
      createImageSparseMemoryAliasingTests::imageParametersArray[0].imageType = IMAGE_TYPE_2D;
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[0].imageSizes,0x200,
                 0x100,1);
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[0].imageSizes + 1,0x80,
                 0x80,1);
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[0].imageSizes + 2,0x1f7,
                 0x89,1);
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[0].imageSizes + 3,0xb,
                 0x25,1);
      createImageSparseMemoryAliasingTests::imageParametersArray[1].imageType = IMAGE_TYPE_2D_ARRAY;
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[1].imageSizes,0x200,
                 0x100,6);
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[1].imageSizes + 1,0x80,
                 0x80,8);
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[1].imageSizes + 2,0x1f7,
                 0x89,3);
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[1].imageSizes + 3,0xb,
                 0x25,3);
      createImageSparseMemoryAliasingTests::imageParametersArray[2].imageType = IMAGE_TYPE_CUBE;
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[2].imageSizes,0x100,
                 0x100,1);
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[2].imageSizes + 1,0x80,
                 0x80,1);
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[2].imageSizes + 2,0x89,
                 0x89,1);
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[2].imageSizes + 3,0xb,
                 0xb,1);
      createImageSparseMemoryAliasingTests::imageParametersArray[3].imageType =
           IMAGE_TYPE_CUBE_ARRAY;
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[3].imageSizes,0x100,
                 0x100,6);
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[3].imageSizes + 1,0x80,
                 0x80,8);
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[3].imageSizes + 2,0x89,
                 0x89,3);
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[3].imageSizes + 3,0xb,
                 0xb,3);
      createImageSparseMemoryAliasingTests::imageParametersArray[4].imageType = IMAGE_TYPE_3D;
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[4].imageSizes,0x100,
                 0x100,0x10);
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[4].imageSizes + 1,0x80,
                 0x80,8);
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[4].imageSizes + 2,0x1f7,
                 0x89,3);
      tcu::Vector<unsigned_int,_3>::Vector
                (createImageSparseMemoryAliasingTests::imageParametersArray[4].imageSizes + 3,0xb,
                 0x25,3);
      __cxa_guard_release(&createImageSparseMemoryAliasingTests(tcu::TestContext&)::
                           imageParametersArray);
    }
  }
  if (createImageSparseMemoryAliasingTests(tcu::TestContext&)::formats == '\0') {
    iVar2 = __cxa_guard_acquire(&createImageSparseMemoryAliasingTests(tcu::TestContext&)::formats);
    if (iVar2 != 0) {
      tcu::TextureFormat::TextureFormat
                (createImageSparseMemoryAliasingTests::formats,R,SIGNED_INT32);
      tcu::TextureFormat::TextureFormat
                (createImageSparseMemoryAliasingTests::formats + 1,R,SIGNED_INT16);
      tcu::TextureFormat::TextureFormat
                (createImageSparseMemoryAliasingTests::formats + 2,R,SIGNED_INT8);
      tcu::TextureFormat::TextureFormat
                (createImageSparseMemoryAliasingTests::formats + 3,RGBA,UNSIGNED_INT32);
      tcu::TextureFormat::TextureFormat
                (createImageSparseMemoryAliasingTests::formats + 4,RGBA,UNSIGNED_INT16);
      tcu::TextureFormat::TextureFormat
                (createImageSparseMemoryAliasingTests::formats + 5,RGBA,UNSIGNED_INT8);
      __cxa_guard_release(&createImageSparseMemoryAliasingTests(tcu::TestContext&)::formats);
    }
  }
  for (imageTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
       m_data._12_4_ = 0;
      (int)imageTypeGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
           _12_4_ < 5;
      imageTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._12_4_ =
           imageTypeGroup.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
           _12_4_ + 1) {
    imageTypeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
    m_data._8_4_ = createImageSparseMemoryAliasingTests::imageParametersArray
                   [(int)imageTypeGroup.
                         super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                         .m_data._12_4_].imageType;
    pTVar4 = (TestCaseGroup *)operator_new(0x70);
    uVar1 = testGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
            m_data._8_8_;
    format._7_1_ = 1;
    getImageTypeName_abi_cxx11_
              ((string *)&formatNdx,
               (sparse *)
               (ulong)(uint)imageTypeGroup.
                            super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            .m_data._8_4_,imageType_00);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    tcu::TestCaseGroup::TestCaseGroup(pTVar4,(TestContext *)uVar1,pcVar5,"");
    format._7_1_ = 0;
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
              ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&format + 6));
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_48,
               pTVar4);
    std::__cxx11::string::~string((string *)&formatNdx);
    for (format._0_4_ = 0; (int)format < 6; format._0_4_ = (int)format + 1) {
      formatGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._8_8_ = createImageSparseMemoryAliasingTests::formats + (int)format;
      pTVar4 = (TestCaseGroup *)operator_new(0x70);
      uVar1 = testGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              _8_8_;
      imageSize.m_data[2]._3_1_ = 1;
      getShaderImageFormatQualifier_abi_cxx11_
                ((string *)&imageSizeNdx,
                 (sparse *)
                 formatGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data._8_8_,format_00);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      tcu::TestCaseGroup::TestCaseGroup(pTVar4,(TestContext *)uVar1,pcVar5,"");
      imageSize.m_data[2]._3_1_ = 0;
      de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
                ((DefaultDeleter<tcu::TestCaseGroup> *)((long)imageSize.m_data + 10));
      de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
                ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_88,
                 pTVar4);
      std::__cxx11::string::~string((string *)&imageSizeNdx);
      for (imageSize.m_data[1] = 0; (int)imageSize.m_data[1] < 4;
          imageSize.m_data[1] = imageSize.m_data[1] + 1) {
        tcu::Vector<unsigned_int,_3>::Vector
                  ((Vector<unsigned_int,_3> *)local_bc,
                   (Vector<unsigned_int,_3> *)
                   ((long)(int)imageTypeGroup.
                               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                               .m_data._12_4_ * 0x34 + 0x16b1754 +
                   (long)(int)imageSize.m_data[1] * 0xc));
        std::__cxx11::ostringstream::ostringstream(local_238);
        uVar3 = tcu::Vector<unsigned_int,_3>::x((Vector<unsigned_int,_3> *)local_bc);
        poVar6 = (ostream *)std::ostream::operator<<(local_238,uVar3);
        poVar6 = std::operator<<(poVar6,"_");
        uVar3 = tcu::Vector<unsigned_int,_3>::y((Vector<unsigned_int,_3> *)local_bc);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar3);
        poVar6 = std::operator<<(poVar6,"_");
        uVar3 = tcu::Vector<unsigned_int,_3>::z((Vector<unsigned_int,_3> *)local_bc);
        std::ostream::operator<<(poVar6,uVar3);
        pTVar7 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_88)->super_TestNode;
        this = (ImageSparseMemoryAliasingCase *)operator_new(0x90);
        uVar1 = testGroup.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                ._8_8_;
        std::__cxx11::ostringstream::str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"",&local_279);
        anon_unknown_2::ImageSparseMemoryAliasingCase::ImageSparseMemoryAliasingCase
                  (this,(TestContext *)uVar1,&local_258,&local_278,
                   imageTypeGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data._8_4_,(UVec3 *)local_bc,
                   (TextureFormat *)
                   formatGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data._8_8_,GLSL_VERSION_440);
        tcu::TestNode::addChild(pTVar7,(TestNode *)this);
        std::__cxx11::string::~string((string *)&local_278);
        std::allocator<char>::~allocator(&local_279);
        std::__cxx11::string::~string((string *)&local_258);
        std::__cxx11::ostringstream::~ostringstream(local_238);
      }
      pTVar7 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                ::operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)local_48)->super_TestNode;
      pTVar8 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                        local_88)->super_TestNode;
      tcu::TestNode::addChild(pTVar7,pTVar8);
      de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
                ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_88);
    }
    pTVar7 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_20)->super_TestNode;
    pTVar8 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      local_48)->super_TestNode;
    tcu::TestNode::addChild(pTVar7,pTVar8);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_48);
  }
  pTVar4 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar4;
}

Assistant:

tcu::TestCaseGroup* createImageSparseMemoryAliasingTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> testGroup(new tcu::TestCaseGroup(testCtx, "image_sparse_memory_aliasing", "Sparse Image Memory Aliasing"));

	static const deUint32 sizeCountPerImageType = 4u;

	struct ImageParameters
	{
		ImageType	imageType;
		tcu::UVec3	imageSizes[sizeCountPerImageType];
	};

	static const ImageParameters imageParametersArray[] =
	{
		{ IMAGE_TYPE_2D,		{ tcu::UVec3(512u, 256u, 1u),	tcu::UVec3(128u, 128u, 1u),	tcu::UVec3(503u, 137u, 1u),	tcu::UVec3(11u, 37u, 1u) } },
		{ IMAGE_TYPE_2D_ARRAY,	{ tcu::UVec3(512u, 256u, 6u),	tcu::UVec3(128u, 128u, 8u),	tcu::UVec3(503u, 137u, 3u),	tcu::UVec3(11u, 37u, 3u) } },
		{ IMAGE_TYPE_CUBE,		{ tcu::UVec3(256u, 256u, 1u),	tcu::UVec3(128u, 128u, 1u),	tcu::UVec3(137u, 137u, 1u),	tcu::UVec3(11u, 11u, 1u) } },
		{ IMAGE_TYPE_CUBE_ARRAY,{ tcu::UVec3(256u, 256u, 6u),	tcu::UVec3(128u, 128u, 8u),	tcu::UVec3(137u, 137u, 3u),	tcu::UVec3(11u, 11u, 3u) } },
		{ IMAGE_TYPE_3D,		{ tcu::UVec3(256u, 256u, 16u),	tcu::UVec3(128u, 128u, 8u),	tcu::UVec3(503u, 137u, 3u),	tcu::UVec3(11u, 37u, 3u) } }
	};

	static const tcu::TextureFormat formats[] =
	{
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::R,	 tcu::TextureFormat::SIGNED_INT8),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT32),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT16),
		tcu::TextureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNSIGNED_INT8)
	};

	for (deInt32 imageTypeNdx = 0; imageTypeNdx < DE_LENGTH_OF_ARRAY(imageParametersArray); ++imageTypeNdx)
	{
		const ImageType					imageType = imageParametersArray[imageTypeNdx].imageType;
		de::MovePtr<tcu::TestCaseGroup> imageTypeGroup(new tcu::TestCaseGroup(testCtx, getImageTypeName(imageType).c_str(), ""));

		for (deInt32 formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); ++formatNdx)
		{
			const tcu::TextureFormat&		format = formats[formatNdx];
			de::MovePtr<tcu::TestCaseGroup> formatGroup(new tcu::TestCaseGroup(testCtx, getShaderImageFormatQualifier(format).c_str(), ""));

			for (deInt32 imageSizeNdx = 0; imageSizeNdx < DE_LENGTH_OF_ARRAY(imageParametersArray[imageTypeNdx].imageSizes); ++imageSizeNdx)
			{
				const tcu::UVec3 imageSize = imageParametersArray[imageTypeNdx].imageSizes[imageSizeNdx];

				std::ostringstream stream;
				stream << imageSize.x() << "_" << imageSize.y() << "_" << imageSize.z();

				formatGroup->addChild(new ImageSparseMemoryAliasingCase(testCtx, stream.str(), "", imageType, imageSize, format, glu::GLSL_VERSION_440));
			}
			imageTypeGroup->addChild(formatGroup.release());
		}
		testGroup->addChild(imageTypeGroup.release());
	}

	return testGroup.release();
}